

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboBlendCase::FboBlendCase
          (FboBlendCase *this,Context *context,char *name,char *desc,deUint32 format,IVec2 *size,
          deUint32 funcRGB,deUint32 funcAlpha,deUint32 srcRGB,deUint32 dstRGB,deUint32 srcAlpha,
          deUint32 dstAlpha)

{
  FboColorbufferCase::FboColorbufferCase(&this->super_FboColorbufferCase,context,name,desc,format);
  (this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__FboTestCase_00c250d0;
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&(this->super_FboColorbufferCase).field_0x8c,size);
  this->m_funcRGB = funcRGB;
  this->m_funcAlpha = funcAlpha;
  this->m_srcRGB = srcRGB;
  this->m_dstRGB = dstRGB;
  this->m_srcAlpha = srcAlpha;
  this->m_dstAlpha = dstAlpha;
  return;
}

Assistant:

FboBlendCase (Context& context, const char* name, const char* desc, deUint32 format, IVec2 size, deUint32 funcRGB, deUint32 funcAlpha, deUint32 srcRGB, deUint32 dstRGB, deUint32 srcAlpha, deUint32 dstAlpha)
		: FboColorbufferCase	(context, name, desc, format)
		, m_size				(size)
		, m_funcRGB				(funcRGB)
		, m_funcAlpha			(funcAlpha)
		, m_srcRGB				(srcRGB)
		, m_dstRGB				(dstRGB)
		, m_srcAlpha			(srcAlpha)
		, m_dstAlpha			(dstAlpha)
	{
	}